

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetMinReduction(void *arkode_mem,sunrealtype eta_min)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"ARKodeSetMinReduction",&ark_mem,&hadapt_mem);
  if (iVar1 == 0) {
    if (ark_mem->step_supports_adaptive == 0) {
      iVar1 = -0x30;
      arkProcessError(ark_mem,-0x30,0x6b0,"ARKodeSetMinReduction",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
    }
    else {
      if ((1.0 <= eta_min) || (eta_min <= 0.0)) {
        hadapt_mem->etamin = 0.1;
      }
      else {
        hadapt_mem->etamin = eta_min;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeSetMinReduction(void* arkode_mem, sunrealtype eta_min)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* set allowed value, otherwise set default */
  if (eta_min >= ONE || eta_min <= ZERO) { hadapt_mem->etamin = ETAMIN; }
  else { hadapt_mem->etamin = eta_min; }

  return (ARK_SUCCESS);
}